

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

uint add_not_list_to_class
               (uint8_t *classbits,PCRE2_UCHAR16 **uchardptr,uint32_t options,compile_block_16 *cb,
               uint32_t *p)

{
  uint in_EAX;
  uint32_t *puVar1;
  uint32_t start;
  uint32_t uVar2;
  uint32_t end;
  
  if (*p != 0) {
    uVar2 = *p - 1;
    cb->class_range_start = 0;
    cb->class_range_end = uVar2;
    in_EAX = add_to_class_internal(classbits,uchardptr,options,cb,0,uVar2);
  }
  if (*p != 0xffffffff) {
    do {
      do {
        puVar1 = p + 1;
        uVar2 = *puVar1;
        start = *p + 1;
        p = puVar1;
      } while (uVar2 == start);
      end = uVar2 - 1;
      if (uVar2 == 0xffffffff) {
        end = ((options >> 0x13 & 1) != 0) - 1 | 0x10ffff;
      }
      cb->class_range_start = start;
      cb->class_range_end = end;
      in_EAX = add_to_class_internal(classbits,uchardptr,options,cb,start,end);
    } while (*puVar1 != 0xffffffff);
  }
  return in_EAX;
}

Assistant:

static unsigned int
add_not_list_to_class(uint8_t *classbits, PCRE2_UCHAR **uchardptr,
  uint32_t options, compile_block *cb, const uint32_t *p)
{
BOOL utf = (options & PCRE2_UTF) != 0;
unsigned int n8 = 0;
if (p[0] > 0)
  n8 += add_to_class(classbits, uchardptr, options, cb, 0, p[0] - 1);
while (p[0] < NOTACHAR)
  {
  while (p[1] == p[0] + 1) p++;
  n8 += add_to_class(classbits, uchardptr, options, cb, p[0] + 1,
    (p[1] == NOTACHAR) ? (utf ? 0x10ffffu : 0xffffffffu) : p[1] - 1);
  p++;
  }
return n8;
}